

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

uintptr_t nettlp_msg_get_bar4_start(in_addr addr)

{
  ssize_t sVar1;
  int *piVar2;
  pollfd x [1];
  uintptr_t bar4_addr;
  int ret;
  int req;
  int sock;
  pollfd local_28;
  uintptr_t local_20;
  int local_18;
  undefined4 local_14;
  in_addr in_stack_fffffffffffffff0;
  int __fd;
  
  local_18 = 0;
  local_20 = 0;
  local_28.fd = nettlp_msg_socket(in_stack_fffffffffffffff0);
  if (0 < local_28.fd) {
    local_14 = 1;
    sVar1 = write(local_28.fd,&local_14,4);
    local_18 = (int)sVar1;
    local_28.events = 1;
    __fd = local_28.fd;
    local_18 = poll(&local_28,1,500);
    if (local_18 == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0x3e;
    }
    else {
      sVar1 = read(__fd,&local_20,8);
      local_18 = (int)sVar1;
      if (-1 < local_18) {
        close(__fd);
        return local_20;
      }
    }
    close(__fd);
  }
  return 0;
}

Assistant:

uintptr_t nettlp_msg_get_bar4_start(struct in_addr addr)
{
	int sock, req, ret = 0;
	uintptr_t bar4_addr = 0;
	struct pollfd x[1];

	sock = nettlp_msg_socket(addr);
	if (sock < 1)
		return 0;

	/* send GET_BAR4 request */
	req = NETTLP_MSG_GET_BAR4_ADDR;
	ret = write(sock, &req, sizeof(req));

	/* recv response with timeout */
	x[0].fd = sock;
	x[0].events = POLLIN;

	ret = poll(x, 1, LIBTLP_CPL_TIMEOUT);
	if (ret == 0) {
		errno = ETIME;
		goto err_out;
	}

	ret = read(sock, &bar4_addr, sizeof(bar4_addr));
	if (ret < 0)
		goto err_out;

	close(sock);
	return bar4_addr;

err_out:
	close(sock);
	return 0;
}